

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O3

bool __thiscall QSslSocketPrivate::verifyProtocolSupported(QSslSocketPrivate *this,char *where)

{
  char *pcVar1;
  SslProtocol SVar2;
  int *piVar3;
  QDebug QVar4;
  bool bVar5;
  QLoggingCategory *pQVar6;
  storage_type *psVar7;
  storage_type *psVar8;
  char *pcVar9;
  Latin1Content LVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QString local_78;
  char *local_60;
  QDebug local_58;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  SVar2 = (this->configuration).protocol;
  if ((uint)(SVar2 + ~TlsV1_2OrLater) < 4) {
    pcVar9 = "DTLS";
    LVar10 = 4;
  }
  else {
    bVar5 = true;
    if (SVar2 != UnknownProtocol) goto LAB_0024bb99;
    pcVar9 = "UnknownProtocol";
    LVar10 = 0xf;
  }
  pQVar6 = QtPrivateLogging::lcSsl();
  if (((pQVar6->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
    local_60 = pQVar6->name;
    local_78.d.d._0_4_ = 2;
    local_78.d.d._4_4_ = 0;
    local_78.d.ptr._0_4_ = 0;
    local_78.d._12_8_ = 0;
    local_78.d.size._4_4_ = 0;
    QMessageLogger::warning();
    QVar4.stream = local_58.stream;
    if (where == (char *)0x0) {
      psVar8 = (storage_type *)0x0;
    }
    else {
      psVar7 = (storage_type *)0xffffffffffffffff;
      do {
        psVar8 = psVar7 + 1;
        pcVar1 = where + 1 + (long)psVar7;
        psVar7 = psVar8;
      } while (*pcVar1 != '\0');
    }
    QVar11.m_data = psVar8;
    QVar11.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar11);
    QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QVar4.stream = local_58.stream;
    QVar12.m_data = (storage_type *)0x2a;
    QVar12.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar12);
    QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QDebug::putByteArray((char *)&local_58,(ulong)pcVar9,LVar10);
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QDebug::~QDebug(&local_58);
  }
  QMetaObject::tr((char *)&local_78,(char *)&QSslSocket::staticMetaObject,0x27f86a);
  QAbstractSocketPrivate::setErrorAndEmit
            ((QAbstractSocketPrivate *)this,SslInvalidUserDataError,&local_78);
  piVar3 = (int *)CONCAT44(local_78.d.d._4_4_,local_78.d.d._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_78.d.d._4_4_,local_78.d.d._0_4_),2,0x10);
    }
  }
  bVar5 = false;
LAB_0024bb99:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool QSslSocketPrivate::verifyProtocolSupported(const char *where)
{
    auto protocolName = "DTLS"_L1;
    switch (configuration.protocol) {
    case QSsl::UnknownProtocol:
        // UnknownProtocol, according to our docs, is for cipher whose protocol is unknown.
        // Should not be used when configuring QSslSocket.
        protocolName = "UnknownProtocol"_L1;
        Q_FALLTHROUGH();
QT_WARNING_PUSH
QT_WARNING_DISABLE_DEPRECATED
    case QSsl::DtlsV1_0:
    case QSsl::DtlsV1_2:
    case QSsl::DtlsV1_0OrLater:
    case QSsl::DtlsV1_2OrLater:
        qCWarning(lcSsl) << where << "QSslConfiguration with unexpected protocol" << protocolName;
        setErrorAndEmit(QAbstractSocket::SslInvalidUserDataError,
                        QSslSocket::tr("Attempted to use an unsupported protocol."));
        return false;
QT_WARNING_POP
    default:
        return true;
    }
}